

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

void __thiscall DMenu::Drawer(DMenu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  FTexture *this_00;
  double x;
  double y;
  uint uVar4;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  if ((((CurrentMenu == this) && (0.0 < BackbuttonAlpha)) && (-1 < m_show_backbutton.Value)) &&
     (m_use_mouse.Value != 0)) {
    this_00 = FTextureManager::operator()(&TexMan,gameinfo.mBackButton.Chars);
    iVar2 = FTexture::GetScaledWidth(this_00);
    iVar1 = CleanXfac;
    iVar3 = FTexture::GetScaledHeight(this_00);
    y = 0.0;
    x = 0.0;
    if ((m_show_backbutton.Value & 1U) != 0) {
      x = (double)((screen->super_DSimpleCanvas).super_DCanvas.Width - iVar1 * iVar2);
    }
    if ((m_show_backbutton.Value & 2U) != 0) {
      y = (double)((screen->super_DSimpleCanvas).super_DCanvas.Height - iVar3 * CleanYfac);
    }
    if (((this->super_DObject).field_0x25 == '\0') ||
       (((this->super_DObject).field_0x24 == '\0' && (m_use_mouse.Value != 1)))) {
      DCanvas::DrawTexture
                ((DCanvas *)screen,this_00,x,y,0x40001393,(double)BackbuttonAlpha,1,0x4000138c,0);
      return;
    }
    DCanvas::DrawTexture
              ((DCanvas *)screen,this_00,x,y,0x40001393,1,0x400013aa,0x28ffffff,(ulong)uVar4 << 0x20
              );
  }
  return;
}

Assistant:

void DMenu::Drawer () 
{
	if (this == DMenu::CurrentMenu && BackbuttonAlpha > 0 && m_show_backbutton >= 0 && m_use_mouse)
	{
		FTexture *tex = TexMan(gameinfo.mBackButton);
		int w = tex->GetScaledWidth() * CleanXfac;
		int h = tex->GetScaledHeight() * CleanYfac;
		int x = (!(m_show_backbutton&1))? 0:screen->GetWidth() - w;
		int y = (!(m_show_backbutton&2))? 0:screen->GetHeight() - h;
		if (mBackbuttonSelected && (mMouseCapture || m_use_mouse == 1))
		{
			screen->DrawTexture(tex, x, y, DTA_CleanNoMove, true, DTA_ColorOverlay, MAKEARGB(40, 255,255,255), TAG_DONE);
		}
		else
		{
			screen->DrawTexture(tex, x, y, DTA_CleanNoMove, true, DTA_AlphaF, BackbuttonAlpha, TAG_DONE);
		}
	}
}